

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  *(undefined ***)&this->field_0x78 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x80 = 0;
  *(char **)&this->field_0x88 = "IfcPolygonalBoundedHalfSpace";
  IfcHalfSpaceSolid::IfcHalfSpaceSolid
            (&this->super_IfcHalfSpaceSolid,&PTR_construction_vtable_24__00840790);
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x60 = 0;
  (this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8406d8;
  *(undefined8 *)&this->field_0x78 = 0x840778;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x840700;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x840728;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x58 = 0x840750;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x68 = 0;
  (this->PolygonalBoundary).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}